

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O0

void __thiscall EmitPrettyPrint::setMaxLineSize(EmitPrettyPrint *this,int4 val)

{
  LowlevelError *this_00;
  allocator local_39;
  string local_38 [36];
  int4 local_14;
  EmitPrettyPrint *pEStack_10;
  int4 val_local;
  EmitPrettyPrint *this_local;
  
  local_14 = val;
  pEStack_10 = this;
  if ((0x13 < val) && (val < 0x2711)) {
    this->maxlinesize = val;
    circularqueue<int>::setMax(&this->scanqueue,val * 3);
    circularqueue<TokenSplit>::setMax(&this->tokqueue,local_14 * 3);
    this->spaceremain = this->maxlinesize;
    (*(this->super_EmitXml)._vptr_EmitXml[0x1e])();
    return;
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Bad maximum line size",&local_39);
  LowlevelError::LowlevelError(this_00,(string *)local_38);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void EmitPrettyPrint::setMaxLineSize(int4 val)

{
  if ((val<20)||(val>10000))
    throw LowlevelError("Bad maximum line size");
  maxlinesize = val;
  scanqueue.setMax(3*val);
  tokqueue.setMax(3*val);
  spaceremain = maxlinesize;
  clear();
}